

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O2

string * __thiscall
VulkanUtilities::PrintExtensionsList_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,
          vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
          size_t NumColumns)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *pvVar5;
  ulong uVar6;
  size_type *psVar7;
  char *pcVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ExtStrings;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ColWidth;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long lStack_198;
  uint auStack_190 [88];
  
  if (Extensions == (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0) {
    Diligent::FormatString<char[26],char[15]>
              ((string *)&ss,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumColumns > 0",(char (*) [15])NumColumns);
    Diligent::DebugAssertionFailed
              (_ss,"PrintExtensionsList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x3c);
    std::__cxx11::string::~string((string *)&ss);
  }
  ExtStrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ExtStrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ExtStrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&ExtStrings,(*(long *)(this + 8) - *(long *)this) / 0x104);
  pcVar1 = *(char **)(this + 8);
  for (pcVar8 = *(char **)this; pcVar8 != pcVar1; pcVar8 = pcVar8 + 0x104) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<((ostream *)local_1a8._M_local_buf,pcVar8);
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'.');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'.');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ExtStrings,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ColWidth);
    std::__cxx11::string::~string((string *)&ColWidth);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&ColWidth,(size_type)Extensions,(allocator_type *)&ss);
  uVar3 = (*(long *)(this + 8) - *(long *)this) / 0x104;
  uVar6 = 0;
  while (uVar4 = uVar6, uVar4 < uVar3) {
    psVar7 = &ExtStrings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_string_length;
    pvVar5 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0;
    while ((uVar6 = (long)&(pvVar5->
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar4, pvVar5 < Extensions
           && (uVar6 < uVar3))) {
      uVar6 = *psVar7;
      if (*psVar7 < ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)pvVar5]) {
        uVar6 = ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pvVar5];
      }
      ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pvVar5] = uVar6;
      pvVar5 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
               ((long)&(pvVar5->
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
      psVar7 = psVar7 + 4;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar6 = 0;
  while (uVar6 < (ulong)((*(long *)(this + 8) - *(long *)this) / 0x104)) {
    lVar9 = uVar6 << 5;
    pvVar5 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1;
    for (; ((long)pvVar5 - (long)Extensions != 1 &&
           (uVar6 < (ulong)((*(long *)(this + 8) - *(long *)this) / 0x104))); uVar6 = uVar6 + 1) {
      pcVar8 = "    ";
      if (pvVar5 == (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1) {
        pcVar8 = "\n    ";
      }
      std::operator<<((ostream *)local_1a8._M_local_buf,pcVar8);
      if ((pvVar5 < Extensions) &&
         (uVar6 + 1 < (ulong)((*(long *)(this + 8) - *(long *)this) / 0x104))) {
        *(long *)((long)&lStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
             (long)(int)ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [(long)((long)&pvVar5[-1].
                                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)];
        *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
             0xffffff4f | 0x20;
      }
      std::operator<<((ostream *)local_1a8._M_local_buf,
                      (string *)
                      ((long)&((ExtStrings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar9));
      lVar9 = lVar9 + 0x20;
      pvVar5 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
               ((long)&(pvVar5->
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ExtStrings);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintExtensionsList(const std::vector<VkExtensionProperties>& Extensions, size_t NumColumns)
{
    VERIFY_EXPR(NumColumns > 0);

    std::vector<std::string> ExtStrings;
    ExtStrings.reserve(Extensions.size());
    for (const auto& Ext : Extensions)
    {
        std::stringstream ss;
        ss << Ext.extensionName << ' '
           << VK_API_VERSION_MAJOR(Ext.specVersion) << '.'
           << VK_API_VERSION_MINOR(Ext.specVersion) << '.'
           << VK_API_VERSION_PATCH(Ext.specVersion);
        ExtStrings.emplace_back(ss.str());
    }

    std::vector<size_t> ColWidth(NumColumns);
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ColWidth[col] = std::max(ColWidth[col], ExtStrings[i].length());
        }
    }

    std::stringstream ss;
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ss << (col == 0 ? "\n    " : "    ");
            if (col + 1 < NumColumns && i + 1 < Extensions.size())
                ss << std::setw(static_cast<int>(ColWidth[col])) << std::left;
            ss << ExtStrings[i];
        }
    }

    return ss.str();
}